

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O0

set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *
__thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::gather
          (DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *this,IntervalT *I)

{
  bool bVar1;
  _Rb_tree_const_iterator<dg::dda::RWNode_*> in_RDI;
  const_iterator it;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *ret;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 uVar2;
  _Rb_tree_const_iterator<dg::dda::RWNode_*> __first;
  _Self local_40 [2];
  _Self local_30;
  _Self local_28;
  undefined1 local_19;
  
  local_19 = 0;
  __first._M_node = in_RDI._M_node;
  std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::set
            ((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              *)0x179b74);
  local_28._M_node =
       (_Base_ptr)
       le(in_RDI._M_node,(IntervalT *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90))
  ;
  local_30._M_node =
       (_Base_ptr)
       end((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)in_stack_ffffffffffffff88);
  bVar1 = std::operator==(&local_28,&local_30);
  if (!bVar1) {
    while( true ) {
      local_40[0]._M_node =
           (_Base_ptr)
           end((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)in_stack_ffffffffffffff88);
      bVar1 = std::operator!=(&local_28,local_40);
      uVar2 = false;
      if (bVar1) {
        std::
        _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                      *)0x179bf7);
        uVar2 = DiscreteInterval<dg::Offset>::overlaps
                          ((DiscreteInterval<dg::Offset> *)__first._M_node,
                           (DiscreteInterval<dg::Offset> *)in_RDI._M_node);
      }
      if ((bool)uVar2 == false) break;
      std::
      _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                    *)0x179c1c);
      std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
      ::begin(in_stack_ffffffffffffff88);
      std::
      _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                    *)0x179c37);
      std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
      ::end(in_stack_ffffffffffffff88);
      std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>::
      insert<std::_Rb_tree_const_iterator<dg::dda::RWNode*>>
                ((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                  *)CONCAT17(uVar2,in_stack_ffffffffffffff90),__first,in_RDI);
      std::
      _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                    *)CONCAT17(uVar2,in_stack_ffffffffffffff90));
    }
  }
  return (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *
         )__first._M_node;
}

Assistant:

std::set<ValueT> gather(const IntervalT &I) const {
        std::set<ValueT> ret;

        auto it = le(I);
        if (it == end())
            return ret;

        assert(it->first.overlaps(I) && "The found interval should overlap");
        while (it != end() && it->first.overlaps(I)) {
            ret.insert(it->second.begin(), it->second.end());
            ++it;
        }

        return ret;
    }